

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smatrix.h
# Opt level: O2

SMatrix<long,_2,_3> * __thiscall
gmath::SMatrix<long,_2,_3>::operator=(SMatrix<long,_2,_3> *this,long s)

{
  SMatrix<long,_2,_3> *pSVar1;
  int k;
  long lVar2;
  long lVar3;
  
  pSVar1 = this;
  for (lVar2 = 0; lVar2 != 2; lVar2 = lVar2 + 1) {
    for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
      (*(long (*) [3])*(long (*) [3])this)[lVar3] = s;
    }
    this = (SMatrix<long,_2,_3> *)((long)this + 0x18);
  }
  return pSVar1;
}

Assistant:

SMatrix<T, nrows, ncols> &operator=(T s)
    {
      for (int k=0; k<nrows; k++)
        for (int i=0; i<ncols; i++)
        {
          v[k][i]=s;
        }

      return *this;
    }